

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O1

void av1_dist_wtd_convolve_y_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  short *psVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  undefined4 uVar127;
  undefined4 uVar128;
  undefined4 uVar129;
  undefined4 uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [15];
  undefined1 auVar194 [15];
  undefined1 auVar195 [15];
  undefined1 auVar196 [15];
  undefined1 auVar197 [15];
  undefined1 auVar198 [15];
  ulong uVar199;
  uint uVar200;
  uint8_t *puVar201;
  long lVar202;
  undefined1 (*pauVar203) [16];
  undefined1 (*pauVar204) [16];
  long lVar205;
  uint8_t *puVar206;
  int iVar207;
  long lVar208;
  uint8_t *puVar209;
  char cVar210;
  int iVar211;
  uint8_t *puVar212;
  long lVar213;
  uint8_t *puVar214;
  long lVar215;
  short sVar216;
  short sVar228;
  short sVar229;
  short sVar230;
  short sVar231;
  short sVar232;
  short sVar233;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  short sVar234;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 uVar241;
  undefined1 uVar242;
  undefined4 uVar235;
  undefined1 auVar237 [16];
  int iVar236;
  undefined1 uVar243;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  short sVar244;
  short sVar261;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 uVar284;
  undefined1 uVar285;
  undefined1 uVar286;
  undefined1 uVar288;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar270 [16];
  undefined1 auVar277 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  short sVar322;
  short sVar323;
  undefined1 uVar324;
  undefined1 uVar325;
  undefined1 uVar328;
  undefined1 uVar329;
  undefined1 uVar330;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 uVar340;
  undefined1 uVar341;
  undefined1 auVar331 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined2 uVar342;
  undefined1 auVar343 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  byte bVar358;
  undefined1 uVar376;
  byte bVar377;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar368 [16];
  undefined1 local_148 [16];
  undefined1 auVar226 [16];
  undefined1 auVar249 [16];
  undefined1 auVar256 [16];
  undefined1 auVar250 [16];
  undefined1 auVar257 [16];
  undefined1 auVar251 [16];
  undefined1 auVar258 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  byte bVar287;
  undefined1 auVar300 [16];
  undefined1 auVar311 [16];
  undefined1 auVar301 [16];
  undefined1 auVar312 [16];
  undefined1 auVar302 [16];
  undefined1 auVar313 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  
  pauVar203 = (undefined1 (*) [16])conv_params->dst;
  lVar213 = (long)conv_params->dst_stride;
  iVar207 = 7 - conv_params->round_0;
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
  uVar127 = *(undefined4 *)piVar1;
  uVar128 = *(undefined4 *)(piVar1 + 2);
  uVar129 = *(undefined4 *)(piVar1 + 4);
  uVar130 = *(undefined4 *)(piVar1 + 6);
  iVar211 = conv_params->round_0 + conv_params->round_1;
  cVar210 = (char)iVar211;
  lVar208 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
  puVar214 = src + -lVar208;
  uVar235 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  auVar245 = ZEXT416((uint)((1 << (0x15U - cVar210 & 0x1f)) + (1 << (0x16U - cVar210 & 0x1f))));
  uVar200 = 0xe - iVar211;
  auVar237 = ZEXT416((uint)(1 << ((byte)uVar200 & 0x1f)) >> 1);
  iVar211 = conv_params->do_average;
  auVar289 = ZEXT416((uint)conv_params->round_1);
  iVar6 = conv_params->use_dist_wtd_comp_avg;
  auVar245 = pshuflw(auVar245,auVar245,0);
  auVar237 = pshuflw(auVar237,auVar237,0);
  iVar236 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  lVar202 = (long)src_stride;
  sVar244 = auVar245._0_2_;
  sVar261 = auVar245._2_2_;
  sVar322 = auVar237._0_2_;
  sVar323 = auVar237._2_2_;
  if (w == 4) {
    uVar7 = *(undefined4 *)puVar214;
    uVar8 = *(undefined4 *)(puVar214 + lVar202);
    uVar376 = (undefined1)((uint)uVar8 >> 0x18);
    uVar341 = (undefined1)((uint)uVar8 >> 0x10);
    uVar340 = (undefined1)((uint)uVar8 >> 8);
    uVar9 = *(undefined4 *)(puVar214 + lVar202 * 2);
    uVar243 = (undefined1)((uint)uVar9 >> 0x18);
    uVar242 = (undefined1)((uint)uVar9 >> 0x10);
    uVar241 = (undefined1)((uint)uVar9 >> 8);
    uVar10 = *(undefined4 *)(puVar214 + lVar202 * 3);
    uVar286 = (undefined1)((uint)uVar10 >> 0x18);
    uVar285 = (undefined1)((uint)uVar10 >> 0x10);
    uVar284 = (undefined1)((uint)uVar10 >> 8);
    uVar11 = *(undefined4 *)(puVar214 + lVar202 * 4);
    uVar325 = (undefined1)((uint)uVar11 >> 0x18);
    uVar324 = (undefined1)((uint)uVar11 >> 0x10);
    uVar288 = (undefined1)((uint)uVar11 >> 8);
    uVar12 = *(undefined4 *)(puVar214 + lVar202 * 5);
    uVar330 = (undefined1)((uint)uVar12 >> 0x18);
    uVar329 = (undefined1)((uint)uVar12 >> 0x10);
    uVar328 = (undefined1)((uint)uVar12 >> 8);
    uVar13 = *(undefined4 *)(puVar214 + lVar202 * 6);
    uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar330,uVar325),uVar329),
                                                      CONCAT14(uVar324,uVar11)) >> 0x20),uVar328),
                              uVar288),CONCAT11((char)uVar12,(char)uVar11));
    uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar13 >> 0x18)
                                                                        ,uVar330),
                                                               (char)((uint)uVar13 >> 0x10)),
                                                      CONCAT14(uVar329,uVar12)) >> 0x20),
                                       (char)((uint)uVar13 >> 8)),uVar328),
                     CONCAT11((char)uVar13,(char)uVar12));
    uVar3 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar286,uVar243),uVar285),
                                                      CONCAT14(uVar242,uVar9)) >> 0x20),uVar284),
                              uVar241),CONCAT11((char)uVar10,(char)uVar9));
    uVar199 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar325,uVar286),uVar324),
                                                        CONCAT14(uVar285,uVar10)) >> 0x20),uVar288),
                                uVar284),CONCAT11((char)uVar11,(char)uVar10));
    uVar125 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar376,(char)((uint)uVar7
                                                                                        >> 0x18)),
                                                                 uVar341),
                                                        CONCAT14((char)((uint)uVar7 >> 0x10),uVar7))
                                              >> 0x20),uVar340),(char)((uint)uVar7 >> 8)),
                       CONCAT11((char)uVar8,(char)uVar7));
    uVar126 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar243,uVar376),uVar242),
                                                        CONCAT14(uVar341,uVar8)) >> 0x20),uVar241),
                                uVar340),CONCAT11((char)uVar9,(char)uVar8));
    do {
      uVar124 = uVar199;
      uVar123 = uVar3;
      uVar199 = uVar5;
      uVar3 = uVar4;
      uVar7 = *(undefined4 *)(puVar214 + lVar202 * 7);
      uVar243 = (undefined1)((uint)uVar7 >> 0x18);
      uVar286 = (undefined1)((uint)uVar13 >> 0x18);
      uVar242 = (undefined1)((uint)uVar7 >> 0x10);
      uVar285 = (undefined1)((uint)uVar13 >> 0x10);
      uVar241 = (undefined1)((uint)uVar7 >> 8);
      uVar284 = (undefined1)((uint)uVar13 >> 8);
      bVar287 = (byte)uVar7;
      uVar342 = CONCAT11(bVar287,(byte)uVar13);
      uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar243,uVar286),uVar242),
                                                        CONCAT14(uVar285,uVar13)) >> 0x20),uVar241),
                                uVar284),uVar342);
      auVar29._8_6_ = 0;
      auVar29._0_8_ = uVar125;
      auVar29[0xe] = (char)(uVar125 >> 0x38);
      auVar45._8_4_ = 0;
      auVar45._0_8_ = uVar125;
      auVar45[0xc] = (char)(uVar125 >> 0x30);
      auVar45._13_2_ = auVar29._13_2_;
      auVar61._8_4_ = 0;
      auVar61._0_8_ = uVar125;
      auVar61._12_3_ = auVar45._12_3_;
      auVar77._8_2_ = 0;
      auVar77._0_8_ = uVar125;
      auVar77[10] = (char)(uVar125 >> 0x28);
      auVar77._11_4_ = auVar61._11_4_;
      auVar93._8_2_ = 0;
      auVar93._0_8_ = uVar125;
      auVar93._10_5_ = auVar77._10_5_;
      auVar109[8] = (char)(uVar125 >> 0x20);
      auVar109._0_8_ = uVar125;
      auVar109._9_6_ = auVar93._9_6_;
      auVar151._7_8_ = 0;
      auVar151._0_7_ = auVar109._8_7_;
      auVar167._1_8_ = SUB158(auVar151 << 0x40,7);
      auVar167[0] = (char)(uVar125 >> 0x18);
      auVar167._9_6_ = 0;
      auVar168._1_10_ = SUB1510(auVar167 << 0x30,5);
      auVar168[0] = (char)(uVar125 >> 0x10);
      auVar168._11_4_ = 0;
      auVar217._3_12_ = SUB1512(auVar168 << 0x20,3);
      auVar217[2] = (char)(uVar125 >> 8);
      auVar217[0] = (byte)uVar125;
      auVar217[1] = 0;
      auVar217[0xf] = 0;
      auVar15._8_6_ = 0;
      auVar15._0_8_ = uVar123;
      auVar15[0xe] = (char)(uVar123 >> 0x38);
      auVar30._8_4_ = 0;
      auVar30._0_8_ = uVar123;
      auVar30[0xc] = (char)(uVar123 >> 0x30);
      auVar30._13_2_ = auVar15._13_2_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar123;
      auVar46._12_3_ = auVar30._12_3_;
      auVar62._8_2_ = 0;
      auVar62._0_8_ = uVar123;
      auVar62[10] = (char)(uVar123 >> 0x28);
      auVar62._11_4_ = auVar46._11_4_;
      auVar78._8_2_ = 0;
      auVar78._0_8_ = uVar123;
      auVar78._10_5_ = auVar62._10_5_;
      auVar94[8] = (char)(uVar123 >> 0x20);
      auVar94._0_8_ = uVar123;
      auVar94._9_6_ = auVar78._9_6_;
      auVar152._7_8_ = 0;
      auVar152._0_7_ = auVar94._8_7_;
      auVar169._1_8_ = SUB158(auVar152 << 0x40,7);
      auVar169[0] = (char)(uVar123 >> 0x18);
      auVar169._9_6_ = 0;
      auVar170._1_10_ = SUB1510(auVar169 << 0x30,5);
      auVar170[0] = (char)(uVar123 >> 0x10);
      auVar170._11_4_ = 0;
      auVar111[2] = (char)(uVar123 >> 8);
      auVar111._0_2_ = (ushort)uVar123;
      auVar111._3_12_ = SUB1512(auVar170 << 0x20,3);
      auVar246._0_2_ = (ushort)uVar123 & 0xff;
      auVar246._2_13_ = auVar111._2_13_;
      auVar246[0xf] = 0;
      auVar147._4_4_ = uVar127;
      auVar147._0_4_ = uVar127;
      auVar147._8_4_ = uVar127;
      auVar147._12_4_ = uVar127;
      auVar237 = pmaddwd(auVar217,auVar147);
      auVar143._4_4_ = uVar128;
      auVar143._0_4_ = uVar128;
      auVar143._8_4_ = uVar128;
      auVar143._12_4_ = uVar128;
      auVar247 = pmaddwd(auVar246,auVar143);
      auVar16._8_6_ = 0;
      auVar16._0_8_ = uVar3;
      auVar16[0xe] = (char)(uVar3 >> 0x38);
      auVar31._8_4_ = 0;
      auVar31._0_8_ = uVar3;
      auVar31[0xc] = (char)(uVar3 >> 0x30);
      auVar31._13_2_ = auVar16._13_2_;
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar3;
      auVar47._12_3_ = auVar31._12_3_;
      auVar63._8_2_ = 0;
      auVar63._0_8_ = uVar3;
      auVar63[10] = (char)(uVar3 >> 0x28);
      auVar63._11_4_ = auVar47._11_4_;
      auVar79._8_2_ = 0;
      auVar79._0_8_ = uVar3;
      auVar79._10_5_ = auVar63._10_5_;
      auVar95[8] = (char)(uVar3 >> 0x20);
      auVar95._0_8_ = uVar3;
      auVar95._9_6_ = auVar79._9_6_;
      auVar153._7_8_ = 0;
      auVar153._0_7_ = auVar95._8_7_;
      auVar171._1_8_ = SUB158(auVar153 << 0x40,7);
      auVar171[0] = (char)(uVar3 >> 0x18);
      auVar171._9_6_ = 0;
      auVar172._1_10_ = SUB1510(auVar171 << 0x30,5);
      auVar172[0] = (char)(uVar3 >> 0x10);
      auVar172._11_4_ = 0;
      auVar262._3_12_ = SUB1512(auVar172 << 0x20,3);
      auVar262[2] = (char)(uVar3 >> 8);
      auVar262[0] = (byte)uVar3;
      auVar262[1] = 0;
      auVar262[0xf] = 0;
      auVar139._4_4_ = uVar129;
      auVar139._0_4_ = uVar129;
      auVar139._8_4_ = uVar129;
      auVar139._12_4_ = uVar129;
      auVar263 = pmaddwd(auVar262,auVar139);
      auVar17._8_6_ = 0;
      auVar17._0_8_ = uVar4;
      auVar17[0xe] = uVar243;
      auVar32._8_4_ = 0;
      auVar32._0_8_ = uVar4;
      auVar32[0xc] = uVar286;
      auVar32._13_2_ = auVar17._13_2_;
      auVar48._8_4_ = 0;
      auVar48._0_8_ = uVar4;
      auVar48._12_3_ = auVar32._12_3_;
      auVar64._8_2_ = 0;
      auVar64._0_8_ = uVar4;
      auVar64[10] = uVar242;
      auVar64._11_4_ = auVar48._11_4_;
      auVar80._8_2_ = 0;
      auVar80._0_8_ = uVar4;
      auVar80._10_5_ = auVar64._10_5_;
      auVar96[8] = uVar285;
      auVar96._0_8_ = uVar4;
      auVar96._9_6_ = auVar80._9_6_;
      auVar154._7_8_ = 0;
      auVar154._0_7_ = auVar96._8_7_;
      auVar173._1_8_ = SUB158(auVar154 << 0x40,7);
      auVar173[0] = uVar241;
      auVar173._9_6_ = 0;
      auVar174._1_10_ = SUB1510(auVar173 << 0x30,5);
      auVar174[0] = uVar284;
      auVar174._11_4_ = 0;
      auVar112[2] = bVar287;
      auVar112._0_2_ = uVar342;
      auVar112._3_12_ = SUB1512(auVar174 << 0x20,3);
      auVar218[1] = 0;
      auVar218[0] = (byte)uVar13;
      auVar218._2_13_ = auVar112._2_13_;
      auVar218[0xf] = 0;
      auVar135._4_4_ = uVar130;
      auVar135._0_4_ = uVar130;
      auVar135._8_4_ = uVar130;
      auVar135._12_4_ = uVar130;
      auVar245 = pmaddwd(auVar218,auVar135);
      auVar219._0_4_ =
           (auVar245._0_4_ + auVar263._0_4_ + auVar247._0_4_ + auVar237._0_4_ << iVar207) + iVar236
           >> auVar289;
      auVar219._4_4_ =
           auVar245._4_4_ + auVar263._4_4_ + auVar247._4_4_ + auVar237._4_4_ + iVar236 >> auVar289;
      auVar219._8_4_ =
           auVar245._8_4_ + auVar263._8_4_ + auVar247._8_4_ + auVar237._8_4_ + iVar236 >> auVar289;
      auVar219._12_4_ =
           auVar245._12_4_ + auVar263._12_4_ + auVar247._12_4_ + auVar237._12_4_ + iVar236 >>
           auVar289;
      uVar13 = *(undefined4 *)(puVar214 + lVar202 * 8);
      auVar237 = packssdw(auVar219,auVar219);
      sVar216 = auVar237._0_2_ + sVar244;
      sVar228 = auVar237._2_2_ + sVar261;
      sVar229 = auVar237._4_2_ + sVar244;
      sVar230 = auVar237._6_2_ + sVar261;
      sVar231 = auVar237._8_2_ + sVar244;
      sVar232 = auVar237._10_2_ + sVar261;
      sVar233 = auVar237._12_2_ + sVar244;
      sVar234 = auVar237._14_2_ + sVar261;
      if (iVar211 == 0) {
        *(short *)*pauVar203 = sVar216;
        *(short *)(*pauVar203 + 2) = sVar228;
        *(short *)(*pauVar203 + 4) = sVar229;
        *(short *)(*pauVar203 + 6) = sVar230;
        *(short *)(*pauVar203 + 8) = sVar231;
        *(short *)(*pauVar203 + 10) = sVar232;
        *(short *)(*pauVar203 + 0xc) = sVar233;
        *(short *)(*pauVar203 + 0xe) = sVar234;
      }
      else {
        auVar237 = *pauVar203;
        if (iVar6 == 0) {
          auVar220._0_2_ = sVar216 + auVar237._0_2_;
          auVar220._2_2_ = sVar228 + auVar237._2_2_;
          auVar220._4_2_ = sVar229 + auVar237._4_2_;
          auVar220._6_2_ = sVar230 + auVar237._6_2_;
          auVar220._8_2_ = sVar231 + auVar237._8_2_;
          auVar220._10_2_ = sVar232 + auVar237._10_2_;
          auVar220._12_2_ = sVar233 + auVar237._12_2_;
          auVar220._14_2_ = sVar234 + auVar237._14_2_;
          auVar237 = psraw(auVar220,1);
        }
        else {
          auVar251._0_12_ = auVar237._0_12_;
          auVar251._12_2_ = auVar237._6_2_;
          auVar251._14_2_ = sVar230;
          auVar250._12_4_ = auVar251._12_4_;
          auVar250._0_10_ = auVar237._0_10_;
          auVar250._10_2_ = sVar229;
          auVar249._10_6_ = auVar250._10_6_;
          auVar249._0_8_ = auVar237._0_8_;
          auVar249._8_2_ = auVar237._4_2_;
          auVar248._8_8_ = auVar249._8_8_;
          auVar248._6_2_ = sVar228;
          auVar248._4_2_ = auVar237._2_2_;
          auVar248._2_2_ = sVar216;
          auVar248._0_2_ = auVar237._0_2_;
          auVar290._2_2_ = sVar231;
          auVar290._0_2_ = auVar237._8_2_;
          auVar290._4_2_ = auVar237._10_2_;
          auVar290._6_2_ = sVar232;
          auVar290._8_2_ = auVar237._12_2_;
          auVar290._10_2_ = sVar233;
          auVar290._12_2_ = auVar237._14_2_;
          auVar290._14_2_ = sVar234;
          auVar131._4_4_ = uVar235;
          auVar131._0_4_ = uVar235;
          auVar131._8_4_ = uVar235;
          auVar131._12_4_ = uVar235;
          auVar237 = pmaddwd(auVar248,auVar131);
          auVar245 = pmaddwd(auVar290,auVar131);
          auVar252._0_4_ = auVar237._0_4_ >> 4;
          auVar252._4_4_ = auVar237._4_4_ >> 4;
          auVar252._8_4_ = auVar237._8_4_ >> 4;
          auVar252._12_4_ = auVar237._12_4_ >> 4;
          auVar291._0_4_ = auVar245._0_4_ >> 4;
          auVar291._4_4_ = auVar245._4_4_ >> 4;
          auVar291._8_4_ = auVar245._8_4_ >> 4;
          auVar291._12_4_ = auVar245._12_4_ >> 4;
          auVar237 = packssdw(auVar252,auVar291);
        }
        auVar253._0_2_ = auVar237._0_2_ + (sVar322 - sVar244);
        auVar253._2_2_ = auVar237._2_2_ + (sVar323 - sVar261);
        auVar253._4_2_ = auVar237._4_2_ + (sVar322 - sVar244);
        auVar253._6_2_ = auVar237._6_2_ + (sVar323 - sVar261);
        auVar253._8_2_ = auVar237._8_2_ + (sVar322 - sVar244);
        auVar253._10_2_ = auVar237._10_2_ + (sVar323 - sVar261);
        auVar253._12_2_ = auVar237._12_2_ + (sVar322 - sVar244);
        auVar253._14_2_ = auVar237._14_2_ + (sVar323 - sVar261);
        auVar237 = psraw(auVar253,ZEXT416(uVar200));
        sVar216 = auVar237._0_2_;
        sVar228 = auVar237._2_2_;
        sVar229 = auVar237._4_2_;
        sVar230 = auVar237._6_2_;
        *(uint *)dst0 =
             CONCAT13((0 < sVar230) * (sVar230 < 0x100) * auVar237[6] - (0xff < sVar230),
                      CONCAT12((0 < sVar229) * (sVar229 < 0x100) * auVar237[4] - (0xff < sVar229),
                               CONCAT11((0 < sVar228) * (sVar228 < 0x100) * auVar237[2] -
                                        (0xff < sVar228),
                                        (0 < sVar216) * (sVar216 < 0x100) * auVar237[0] -
                                        (0xff < sVar216))));
      }
      uVar286 = (undefined1)((uint)uVar13 >> 0x18);
      uVar285 = (undefined1)((uint)uVar13 >> 0x10);
      uVar284 = (undefined1)((uint)uVar13 >> 8);
      uVar342 = CONCAT11((char)uVar13,bVar287);
      uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar286,uVar243),uVar285),
                                                        CONCAT14(uVar242,uVar7)) >> 0x20),uVar284),
                                uVar241),uVar342);
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar126;
      auVar18[0xe] = (char)(uVar126 >> 0x38);
      auVar33._8_4_ = 0;
      auVar33._0_8_ = uVar126;
      auVar33[0xc] = (char)(uVar126 >> 0x30);
      auVar33._13_2_ = auVar18._13_2_;
      auVar49._8_4_ = 0;
      auVar49._0_8_ = uVar126;
      auVar49._12_3_ = auVar33._12_3_;
      auVar65._8_2_ = 0;
      auVar65._0_8_ = uVar126;
      auVar65[10] = (char)(uVar126 >> 0x28);
      auVar65._11_4_ = auVar49._11_4_;
      auVar81._8_2_ = 0;
      auVar81._0_8_ = uVar126;
      auVar81._10_5_ = auVar65._10_5_;
      auVar97[8] = (char)(uVar126 >> 0x20);
      auVar97._0_8_ = uVar126;
      auVar97._9_6_ = auVar81._9_6_;
      auVar155._7_8_ = 0;
      auVar155._0_7_ = auVar97._8_7_;
      auVar175._1_8_ = SUB158(auVar155 << 0x40,7);
      auVar175[0] = (char)(uVar126 >> 0x18);
      auVar175._9_6_ = 0;
      auVar176._1_10_ = SUB1510(auVar175 << 0x30,5);
      auVar176[0] = (char)(uVar126 >> 0x10);
      auVar176._11_4_ = 0;
      auVar113[2] = (char)(uVar126 >> 8);
      auVar113._0_2_ = (ushort)uVar126;
      auVar113._3_12_ = SUB1512(auVar176 << 0x20,3);
      auVar359._0_2_ = (ushort)uVar126 & 0xff;
      auVar359._2_13_ = auVar113._2_13_;
      auVar359[0xf] = 0;
      auVar19._8_6_ = 0;
      auVar19._0_8_ = uVar124;
      auVar19[0xe] = (char)(uVar124 >> 0x38);
      auVar34._8_4_ = 0;
      auVar34._0_8_ = uVar124;
      auVar34[0xc] = (char)(uVar124 >> 0x30);
      auVar34._13_2_ = auVar19._13_2_;
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar124;
      auVar50._12_3_ = auVar34._12_3_;
      auVar66._8_2_ = 0;
      auVar66._0_8_ = uVar124;
      auVar66[10] = (char)(uVar124 >> 0x28);
      auVar66._11_4_ = auVar50._11_4_;
      auVar82._8_2_ = 0;
      auVar82._0_8_ = uVar124;
      auVar82._10_5_ = auVar66._10_5_;
      auVar98[8] = (char)(uVar124 >> 0x20);
      auVar98._0_8_ = uVar124;
      auVar98._9_6_ = auVar82._9_6_;
      auVar156._7_8_ = 0;
      auVar156._0_7_ = auVar98._8_7_;
      auVar177._1_8_ = SUB158(auVar156 << 0x40,7);
      auVar177[0] = (char)(uVar124 >> 0x18);
      auVar177._9_6_ = 0;
      auVar178._1_10_ = SUB1510(auVar177 << 0x30,5);
      auVar178[0] = (char)(uVar124 >> 0x10);
      auVar178._11_4_ = 0;
      auVar114[2] = (char)(uVar124 >> 8);
      auVar114._0_2_ = (ushort)uVar124;
      auVar114._3_12_ = SUB1512(auVar178 << 0x20,3);
      auVar221._0_2_ = (ushort)uVar124 & 0xff;
      auVar221._2_13_ = auVar114._2_13_;
      auVar221[0xf] = 0;
      auVar148._4_4_ = uVar127;
      auVar148._0_4_ = uVar127;
      auVar148._8_4_ = uVar127;
      auVar148._12_4_ = uVar127;
      auVar263 = pmaddwd(auVar359,auVar148);
      auVar144._4_4_ = uVar128;
      auVar144._0_4_ = uVar128;
      auVar144._8_4_ = uVar128;
      auVar144._12_4_ = uVar128;
      auVar237 = pmaddwd(auVar221,auVar144);
      auVar20._8_6_ = 0;
      auVar20._0_8_ = uVar199;
      auVar20[0xe] = (char)(uVar199 >> 0x38);
      auVar35._8_4_ = 0;
      auVar35._0_8_ = uVar199;
      auVar35[0xc] = (char)(uVar199 >> 0x30);
      auVar35._13_2_ = auVar20._13_2_;
      auVar51._8_4_ = 0;
      auVar51._0_8_ = uVar199;
      auVar51._12_3_ = auVar35._12_3_;
      auVar67._8_2_ = 0;
      auVar67._0_8_ = uVar199;
      auVar67[10] = (char)(uVar199 >> 0x28);
      auVar67._11_4_ = auVar51._11_4_;
      auVar83._8_2_ = 0;
      auVar83._0_8_ = uVar199;
      auVar83._10_5_ = auVar67._10_5_;
      auVar99[8] = (char)(uVar199 >> 0x20);
      auVar99._0_8_ = uVar199;
      auVar99._9_6_ = auVar83._9_6_;
      auVar157._7_8_ = 0;
      auVar157._0_7_ = auVar99._8_7_;
      auVar179._1_8_ = SUB158(auVar157 << 0x40,7);
      auVar179[0] = (char)(uVar199 >> 0x18);
      auVar179._9_6_ = 0;
      auVar180._1_10_ = SUB1510(auVar179 << 0x30,5);
      auVar180[0] = (char)(uVar199 >> 0x10);
      auVar180._11_4_ = 0;
      auVar115[2] = (char)(uVar199 >> 8);
      auVar115._0_2_ = (ushort)uVar199;
      auVar115._3_12_ = SUB1512(auVar180 << 0x20,3);
      auVar254._0_2_ = (ushort)uVar199 & 0xff;
      auVar254._2_13_ = auVar115._2_13_;
      auVar254[0xf] = 0;
      auVar140._4_4_ = uVar129;
      auVar140._0_4_ = uVar129;
      auVar140._8_4_ = uVar129;
      auVar140._12_4_ = uVar129;
      auVar247 = pmaddwd(auVar254,auVar140);
      auVar21._8_6_ = 0;
      auVar21._0_8_ = uVar5;
      auVar21[0xe] = uVar286;
      auVar36._8_4_ = 0;
      auVar36._0_8_ = uVar5;
      auVar36[0xc] = uVar243;
      auVar36._13_2_ = auVar21._13_2_;
      auVar52._8_4_ = 0;
      auVar52._0_8_ = uVar5;
      auVar52._12_3_ = auVar36._12_3_;
      auVar68._8_2_ = 0;
      auVar68._0_8_ = uVar5;
      auVar68[10] = uVar285;
      auVar68._11_4_ = auVar52._11_4_;
      auVar84._8_2_ = 0;
      auVar84._0_8_ = uVar5;
      auVar84._10_5_ = auVar68._10_5_;
      auVar100[8] = uVar242;
      auVar100._0_8_ = uVar5;
      auVar100._9_6_ = auVar84._9_6_;
      auVar158._7_8_ = 0;
      auVar158._0_7_ = auVar100._8_7_;
      auVar181._1_8_ = SUB158(auVar158 << 0x40,7);
      auVar181[0] = uVar284;
      auVar181._9_6_ = 0;
      auVar182._1_10_ = SUB1510(auVar181 << 0x30,5);
      auVar182[0] = uVar241;
      auVar182._11_4_ = 0;
      auVar116[2] = (char)uVar13;
      auVar116._0_2_ = uVar342;
      auVar116._3_12_ = SUB1512(auVar182 << 0x20,3);
      auVar222[1] = 0;
      auVar222[0] = bVar287;
      auVar222._2_13_ = auVar116._2_13_;
      auVar222[0xf] = 0;
      auVar136._4_4_ = uVar130;
      auVar136._0_4_ = uVar130;
      auVar136._8_4_ = uVar130;
      auVar136._12_4_ = uVar130;
      auVar245 = pmaddwd(auVar222,auVar136);
      auVar223._0_4_ =
           (auVar245._0_4_ + auVar247._0_4_ + auVar237._0_4_ + auVar263._0_4_ << iVar207) + iVar236
           >> auVar289;
      auVar223._4_4_ =
           auVar245._4_4_ + auVar247._4_4_ + auVar237._4_4_ + auVar263._4_4_ + iVar236 >> auVar289;
      auVar223._8_4_ =
           auVar245._8_4_ + auVar247._8_4_ + auVar237._8_4_ + auVar263._8_4_ + iVar236 >> auVar289;
      auVar223._12_4_ =
           auVar245._12_4_ + auVar247._12_4_ + auVar237._12_4_ + auVar263._12_4_ + iVar236 >>
           auVar289;
      auVar237 = packssdw(auVar223,auVar223);
      sVar216 = auVar237._0_2_ + sVar244;
      sVar228 = auVar237._2_2_ + sVar261;
      sVar229 = auVar237._4_2_ + sVar244;
      sVar230 = auVar237._6_2_ + sVar261;
      sVar231 = auVar237._8_2_ + sVar244;
      sVar232 = auVar237._10_2_ + sVar261;
      sVar233 = auVar237._12_2_ + sVar244;
      sVar234 = auVar237._14_2_ + sVar261;
      if (iVar211 == 0) {
        psVar2 = (short *)(*pauVar203 + lVar213 * 2);
        *psVar2 = sVar216;
        psVar2[1] = sVar228;
        psVar2[2] = sVar229;
        psVar2[3] = sVar230;
        psVar2[4] = sVar231;
        psVar2[5] = sVar232;
        psVar2[6] = sVar233;
        psVar2[7] = sVar234;
      }
      else {
        auVar237 = *(undefined1 (*) [16])(*pauVar203 + lVar213 * 2);
        if (iVar6 == 0) {
          auVar224._0_2_ = sVar216 + auVar237._0_2_;
          auVar224._2_2_ = sVar228 + auVar237._2_2_;
          auVar224._4_2_ = sVar229 + auVar237._4_2_;
          auVar224._6_2_ = sVar230 + auVar237._6_2_;
          auVar224._8_2_ = sVar231 + auVar237._8_2_;
          auVar224._10_2_ = sVar232 + auVar237._10_2_;
          auVar224._12_2_ = sVar233 + auVar237._12_2_;
          auVar224._14_2_ = sVar234 + auVar237._14_2_;
          auVar237 = psraw(auVar224,1);
        }
        else {
          auVar258._0_12_ = auVar237._0_12_;
          auVar258._12_2_ = auVar237._6_2_;
          auVar258._14_2_ = sVar230;
          auVar257._12_4_ = auVar258._12_4_;
          auVar257._0_10_ = auVar237._0_10_;
          auVar257._10_2_ = sVar229;
          auVar256._10_6_ = auVar257._10_6_;
          auVar256._0_8_ = auVar237._0_8_;
          auVar256._8_2_ = auVar237._4_2_;
          auVar255._8_8_ = auVar256._8_8_;
          auVar255._6_2_ = sVar228;
          auVar255._4_2_ = auVar237._2_2_;
          auVar255._2_2_ = sVar216;
          auVar255._0_2_ = auVar237._0_2_;
          auVar292._2_2_ = sVar231;
          auVar292._0_2_ = auVar237._8_2_;
          auVar292._4_2_ = auVar237._10_2_;
          auVar292._6_2_ = sVar232;
          auVar292._8_2_ = auVar237._12_2_;
          auVar292._10_2_ = sVar233;
          auVar292._12_2_ = auVar237._14_2_;
          auVar292._14_2_ = sVar234;
          auVar132._4_4_ = uVar235;
          auVar132._0_4_ = uVar235;
          auVar132._8_4_ = uVar235;
          auVar132._12_4_ = uVar235;
          auVar237 = pmaddwd(auVar255,auVar132);
          auVar245 = pmaddwd(auVar292,auVar132);
          auVar259._0_4_ = auVar237._0_4_ >> 4;
          auVar259._4_4_ = auVar237._4_4_ >> 4;
          auVar259._8_4_ = auVar237._8_4_ >> 4;
          auVar259._12_4_ = auVar237._12_4_ >> 4;
          auVar293._0_4_ = auVar245._0_4_ >> 4;
          auVar293._4_4_ = auVar245._4_4_ >> 4;
          auVar293._8_4_ = auVar245._8_4_ >> 4;
          auVar293._12_4_ = auVar245._12_4_ >> 4;
          auVar237 = packssdw(auVar259,auVar293);
        }
        auVar260._0_2_ = auVar237._0_2_ + (sVar322 - sVar244);
        auVar260._2_2_ = auVar237._2_2_ + (sVar323 - sVar261);
        auVar260._4_2_ = auVar237._4_2_ + (sVar322 - sVar244);
        auVar260._6_2_ = auVar237._6_2_ + (sVar323 - sVar261);
        auVar260._8_2_ = auVar237._8_2_ + (sVar322 - sVar244);
        auVar260._10_2_ = auVar237._10_2_ + (sVar323 - sVar261);
        auVar260._12_2_ = auVar237._12_2_ + (sVar322 - sVar244);
        auVar260._14_2_ = auVar237._14_2_ + (sVar323 - sVar261);
        auVar237 = psraw(auVar260,ZEXT416(uVar200));
        sVar216 = auVar237._0_2_;
        sVar228 = auVar237._2_2_;
        sVar229 = auVar237._4_2_;
        sVar230 = auVar237._6_2_;
        *(uint *)(dst0 + dst_stride0) =
             CONCAT13((0 < sVar230) * (sVar230 < 0x100) * auVar237[6] - (0xff < sVar230),
                      CONCAT12((0 < sVar229) * (sVar229 < 0x100) * auVar237[4] - (0xff < sVar229),
                               CONCAT11((0 < sVar228) * (sVar228 < 0x100) * auVar237[2] -
                                        (0xff < sVar228),
                                        (0 < sVar216) * (sVar216 < 0x100) * auVar237[0] -
                                        (0xff < sVar216))));
      }
      puVar214 = puVar214 + lVar202 * 2;
      dst0 = dst0 + dst_stride0 + dst_stride0;
      pauVar203 = (undefined1 (*) [16])(*pauVar203 + lVar213 * 4);
      h = h + -2;
      uVar125 = uVar123;
      uVar126 = uVar124;
    } while (h != 0);
  }
  else {
    lVar14 = (long)dst_stride0 * 2;
    lVar205 = 0;
    do {
      uVar3 = *(ulong *)(puVar214 + lVar202 * 6 + lVar205);
      uVar4 = *(ulong *)(puVar214 + lVar205);
      uVar5 = *(ulong *)(puVar214 + lVar202 + lVar205);
      uVar286 = (undefined1)(uVar5 >> 0x38);
      auVar226._8_6_ = 0;
      auVar226._0_8_ = uVar4;
      auVar226[0xe] = (char)(uVar4 >> 0x38);
      auVar226[0xf] = uVar286;
      auVar295._14_2_ = auVar226._14_2_;
      auVar295._8_5_ = 0;
      auVar295._0_8_ = uVar4;
      uVar285 = (undefined1)(uVar5 >> 0x30);
      auVar295[0xd] = uVar285;
      auVar297._13_3_ = auVar295._13_3_;
      auVar297._8_4_ = 0;
      auVar297._0_8_ = uVar4;
      auVar297[0xc] = (char)(uVar4 >> 0x30);
      auVar240._12_4_ = auVar297._12_4_;
      auVar240._8_3_ = 0;
      auVar240._0_8_ = uVar4;
      uVar284 = (undefined1)(uVar5 >> 0x28);
      auVar240[0xb] = uVar284;
      auVar225._11_5_ = auVar240._11_5_;
      auVar225._8_2_ = 0;
      auVar225._0_8_ = uVar4;
      auVar225[10] = (char)(uVar4 >> 0x28);
      auVar339._10_6_ = auVar225._10_6_;
      auVar339[8] = 0;
      auVar339._0_8_ = uVar4;
      uVar243 = (undefined1)(uVar5 >> 0x20);
      auVar339[9] = uVar243;
      auVar327._9_7_ = auVar339._9_7_;
      auVar327[8] = (char)(uVar4 >> 0x20);
      auVar327._0_8_ = uVar4;
      auVar237._8_8_ = auVar327._8_8_;
      uVar242 = (undefined1)(uVar5 >> 0x18);
      auVar237[7] = uVar242;
      auVar237[6] = (char)(uVar4 >> 0x18);
      uVar241 = (undefined1)(uVar5 >> 0x10);
      auVar237[5] = uVar241;
      auVar237[4] = (char)(uVar4 >> 0x10);
      uVar324 = (undefined1)(uVar5 >> 8);
      auVar237[3] = uVar324;
      auVar237[2] = (char)(uVar4 >> 8);
      auVar237[0] = (undefined1)uVar4;
      auVar263[0] = (undefined1)uVar5;
      auVar237[1] = auVar263[0];
      uVar4 = *(ulong *)(puVar214 + lVar202 * 2 + lVar205);
      uVar288 = (undefined1)(uVar4 >> 0x38);
      auVar349._8_6_ = 0;
      auVar349._0_8_ = uVar5;
      auVar349[0xe] = uVar286;
      auVar349[0xf] = uVar288;
      uVar286 = (undefined1)(uVar4 >> 0x30);
      auVar348._14_2_ = auVar349._14_2_;
      auVar348._8_5_ = 0;
      auVar348._0_8_ = uVar5;
      auVar348[0xd] = uVar286;
      auVar347._13_3_ = auVar348._13_3_;
      auVar347._8_4_ = 0;
      auVar347._0_8_ = uVar5;
      auVar347[0xc] = uVar285;
      uVar285 = (undefined1)(uVar4 >> 0x28);
      auVar346._12_4_ = auVar347._12_4_;
      auVar346._8_3_ = 0;
      auVar346._0_8_ = uVar5;
      auVar346[0xb] = uVar285;
      auVar345._11_5_ = auVar346._11_5_;
      auVar345._8_2_ = 0;
      auVar345._0_8_ = uVar5;
      auVar345[10] = uVar284;
      uVar284 = (undefined1)(uVar4 >> 0x20);
      auVar344._10_6_ = auVar345._10_6_;
      auVar344[8] = 0;
      auVar344._0_8_ = uVar5;
      auVar344[9] = uVar284;
      auVar343._9_7_ = auVar344._9_7_;
      auVar343[8] = uVar243;
      auVar343._0_8_ = uVar5;
      uVar243 = (undefined1)(uVar4 >> 0x18);
      auVar263._8_8_ = auVar343._8_8_;
      auVar263[7] = uVar243;
      auVar263[6] = uVar242;
      uVar242 = (undefined1)(uVar4 >> 0x10);
      auVar263[5] = uVar242;
      auVar263[4] = uVar241;
      uVar241 = (undefined1)(uVar4 >> 8);
      auVar263[3] = uVar241;
      auVar263[2] = uVar324;
      local_148[0] = (undefined1)uVar4;
      auVar263[1] = local_148[0];
      uVar5 = *(ulong *)(puVar214 + lVar202 * 3 + lVar205);
      uVar341 = (undefined1)(uVar5 >> 0x38);
      auVar269._8_6_ = 0;
      auVar269._0_8_ = uVar4;
      auVar269[0xe] = uVar288;
      auVar269[0xf] = uVar341;
      auVar268._14_2_ = auVar269._14_2_;
      auVar268._8_5_ = 0;
      auVar268._0_8_ = uVar4;
      uVar340 = (undefined1)(uVar5 >> 0x30);
      auVar268[0xd] = uVar340;
      auVar267._13_3_ = auVar268._13_3_;
      auVar267._8_4_ = 0;
      auVar267._0_8_ = uVar4;
      auVar267[0xc] = uVar286;
      auVar266._12_4_ = auVar267._12_4_;
      auVar266._8_3_ = 0;
      auVar266._0_8_ = uVar4;
      uVar330 = (undefined1)(uVar5 >> 0x28);
      auVar266[0xb] = uVar330;
      auVar265._11_5_ = auVar266._11_5_;
      auVar265._8_2_ = 0;
      auVar265._0_8_ = uVar4;
      auVar265[10] = uVar285;
      auVar264._10_6_ = auVar265._10_6_;
      auVar264[8] = 0;
      auVar264._0_8_ = uVar4;
      uVar329 = (undefined1)(uVar5 >> 0x20);
      auVar264[9] = uVar329;
      auVar352._9_7_ = auVar264._9_7_;
      auVar352[8] = uVar284;
      auVar352._0_8_ = uVar4;
      local_148._8_8_ = auVar352._8_8_;
      uVar328 = (undefined1)(uVar5 >> 0x18);
      local_148[7] = uVar328;
      local_148[6] = uVar243;
      uVar325 = (undefined1)(uVar5 >> 0x10);
      local_148[5] = uVar325;
      local_148[4] = uVar242;
      uVar324 = (undefined1)(uVar5 >> 8);
      local_148[3] = uVar324;
      local_148[2] = uVar241;
      auVar247[0] = (undefined1)uVar5;
      local_148[1] = auVar247[0];
      uVar4 = *(ulong *)(puVar214 + lVar202 * 4 + lVar205);
      uVar288 = (undefined1)(uVar4 >> 0x38);
      auVar337._8_6_ = 0;
      auVar337._0_8_ = uVar5;
      auVar337[0xe] = uVar341;
      auVar337[0xf] = uVar288;
      uVar286 = (undefined1)(uVar4 >> 0x30);
      auVar336._14_2_ = auVar337._14_2_;
      auVar336._8_5_ = 0;
      auVar336._0_8_ = uVar5;
      auVar336[0xd] = uVar286;
      auVar335._13_3_ = auVar336._13_3_;
      auVar335._8_4_ = 0;
      auVar335._0_8_ = uVar5;
      auVar335[0xc] = uVar340;
      uVar285 = (undefined1)(uVar4 >> 0x28);
      auVar334._12_4_ = auVar335._12_4_;
      auVar334._8_3_ = 0;
      auVar334._0_8_ = uVar5;
      auVar334[0xb] = uVar285;
      auVar333._11_5_ = auVar334._11_5_;
      auVar333._8_2_ = 0;
      auVar333._0_8_ = uVar5;
      auVar333[10] = uVar330;
      uVar284 = (undefined1)(uVar4 >> 0x20);
      auVar332._10_6_ = auVar333._10_6_;
      auVar332[8] = 0;
      auVar332._0_8_ = uVar5;
      auVar332[9] = uVar284;
      auVar331._9_7_ = auVar332._9_7_;
      auVar331[8] = uVar329;
      auVar331._0_8_ = uVar5;
      uVar243 = (undefined1)(uVar4 >> 0x18);
      auVar247._8_8_ = auVar331._8_8_;
      auVar247[7] = uVar243;
      auVar247[6] = uVar328;
      uVar242 = (undefined1)(uVar4 >> 0x10);
      auVar247[5] = uVar242;
      auVar247[4] = uVar325;
      uVar241 = (undefined1)(uVar4 >> 8);
      auVar247[3] = uVar241;
      auVar247[2] = uVar324;
      auVar245[0] = (undefined1)uVar4;
      auVar247[1] = auVar245[0];
      uVar5 = *(ulong *)(puVar214 + lVar202 * 5 + lVar205);
      uVar324 = (undefined1)(uVar5 >> 0x38);
      auVar276._8_6_ = 0;
      auVar276._0_8_ = uVar4;
      auVar276[0xe] = uVar288;
      auVar276[0xf] = uVar324;
      auVar275._14_2_ = auVar276._14_2_;
      auVar275._8_5_ = 0;
      auVar275._0_8_ = uVar4;
      uVar288 = (undefined1)(uVar5 >> 0x30);
      auVar275[0xd] = uVar288;
      auVar274._13_3_ = auVar275._13_3_;
      auVar274._8_4_ = 0;
      auVar274._0_8_ = uVar4;
      auVar274[0xc] = uVar286;
      auVar273._12_4_ = auVar274._12_4_;
      auVar273._8_3_ = 0;
      auVar273._0_8_ = uVar4;
      uVar286 = (undefined1)(uVar5 >> 0x28);
      auVar273[0xb] = uVar286;
      auVar272._11_5_ = auVar273._11_5_;
      auVar272._8_2_ = 0;
      auVar272._0_8_ = uVar4;
      auVar272[10] = uVar285;
      auVar271._10_6_ = auVar272._10_6_;
      auVar271[8] = 0;
      auVar271._0_8_ = uVar4;
      uVar285 = (undefined1)(uVar5 >> 0x20);
      auVar271[9] = uVar285;
      auVar270._9_7_ = auVar271._9_7_;
      auVar270[8] = uVar284;
      auVar270._0_8_ = uVar4;
      auVar245._8_8_ = auVar270._8_8_;
      uVar284 = (undefined1)(uVar5 >> 0x18);
      auVar245[7] = uVar284;
      auVar245[6] = uVar243;
      uVar243 = (undefined1)(uVar5 >> 0x10);
      auVar245[5] = uVar243;
      auVar245[4] = uVar242;
      uVar242 = (undefined1)(uVar5 >> 8);
      auVar245[3] = uVar242;
      auVar245[2] = uVar241;
      auVar360[0] = (undefined1)uVar5;
      auVar245[1] = auVar360[0];
      auVar367._8_6_ = 0;
      auVar367._0_8_ = uVar5;
      auVar367[0xe] = uVar324;
      auVar367[0xf] = (char)(uVar3 >> 0x38);
      auVar366._14_2_ = auVar367._14_2_;
      auVar366._8_5_ = 0;
      auVar366._0_8_ = uVar5;
      auVar366[0xd] = (char)(uVar3 >> 0x30);
      auVar365._13_3_ = auVar366._13_3_;
      auVar365._8_4_ = 0;
      auVar365._0_8_ = uVar5;
      auVar365[0xc] = uVar288;
      auVar364._12_4_ = auVar365._12_4_;
      auVar364._8_3_ = 0;
      auVar364._0_8_ = uVar5;
      auVar364[0xb] = (char)(uVar3 >> 0x28);
      auVar363._11_5_ = auVar364._11_5_;
      auVar363._8_2_ = 0;
      auVar363._0_8_ = uVar5;
      auVar363[10] = uVar286;
      auVar362._10_6_ = auVar363._10_6_;
      auVar362[8] = 0;
      auVar362._0_8_ = uVar5;
      auVar362[9] = (char)(uVar3 >> 0x20);
      auVar361._9_7_ = auVar362._9_7_;
      auVar361[8] = uVar285;
      auVar361._0_8_ = uVar5;
      auVar360._8_8_ = auVar361._8_8_;
      auVar360[7] = (char)(uVar3 >> 0x18);
      auVar360[6] = uVar284;
      auVar360[5] = (char)(uVar3 >> 0x10);
      auVar360[4] = uVar243;
      auVar360[3] = (char)(uVar3 >> 8);
      auVar360[2] = uVar242;
      auVar360[1] = (char)uVar3;
      lVar215 = 0;
      puVar201 = dst0;
      pauVar204 = pauVar203;
      puVar206 = dst0 + dst_stride0;
      puVar209 = src + (src_stride * 7 - lVar208);
      puVar212 = src + (src_stride * 8 - lVar208);
      do {
        auVar225 = auVar247;
        auVar226 = auVar245;
        uVar4 = *(ulong *)(puVar209 + lVar205);
        uVar340 = (undefined1)(uVar4 >> 0x38);
        uVar286 = (undefined1)(uVar3 >> 0x38);
        auVar283._8_6_ = 0;
        auVar283._0_8_ = uVar3;
        auVar283[0xe] = uVar286;
        auVar283[0xf] = uVar340;
        auVar282._14_2_ = auVar283._14_2_;
        auVar282._8_5_ = 0;
        auVar282._0_8_ = uVar3;
        uVar330 = (undefined1)(uVar4 >> 0x30);
        auVar282[0xd] = uVar330;
        uVar285 = (undefined1)(uVar3 >> 0x30);
        auVar281._13_3_ = auVar282._13_3_;
        auVar281._8_4_ = 0;
        auVar281._0_8_ = uVar3;
        auVar281[0xc] = uVar285;
        auVar280._12_4_ = auVar281._12_4_;
        auVar280._8_3_ = 0;
        auVar280._0_8_ = uVar3;
        uVar329 = (undefined1)(uVar4 >> 0x28);
        auVar280[0xb] = uVar329;
        uVar284 = (undefined1)(uVar3 >> 0x28);
        auVar279._11_5_ = auVar280._11_5_;
        auVar279._8_2_ = 0;
        auVar279._0_8_ = uVar3;
        auVar279[10] = uVar284;
        auVar278._10_6_ = auVar279._10_6_;
        auVar278[8] = 0;
        auVar278._0_8_ = uVar3;
        bVar377 = (byte)(uVar4 >> 0x20);
        auVar278[9] = bVar377;
        bVar287 = (byte)(uVar3 >> 0x20);
        auVar277._9_7_ = auVar278._9_7_;
        auVar277[8] = bVar287;
        auVar277._0_8_ = uVar3;
        auVar245._8_8_ = auVar277._8_8_;
        uVar328 = (undefined1)(uVar4 >> 0x18);
        auVar245[7] = uVar328;
        uVar243 = (undefined1)(uVar3 >> 0x18);
        auVar245[6] = uVar243;
        uVar325 = (undefined1)(uVar4 >> 0x10);
        auVar245[5] = uVar325;
        uVar242 = (undefined1)(uVar3 >> 0x10);
        auVar245[4] = uVar242;
        uVar324 = (undefined1)(uVar4 >> 8);
        auVar245[3] = uVar324;
        uVar241 = (undefined1)(uVar3 >> 8);
        auVar245[2] = uVar241;
        bVar358 = (byte)uVar4;
        auVar245._0_2_ = CONCAT11(bVar358,(byte)uVar3);
        auVar37[0xd] = 0;
        auVar37._0_13_ = auVar237._0_13_;
        auVar37[0xe] = auVar237[7];
        auVar53[0xc] = auVar237[6];
        auVar53._0_12_ = auVar237._0_12_;
        auVar53._13_2_ = auVar37._13_2_;
        auVar69[0xb] = 0;
        auVar69._0_11_ = auVar237._0_11_;
        auVar69._12_3_ = auVar53._12_3_;
        auVar85[10] = auVar237[5];
        auVar85._0_10_ = auVar237._0_10_;
        auVar85._11_4_ = auVar69._11_4_;
        auVar101[9] = 0;
        auVar101._0_9_ = auVar237._0_9_;
        auVar101._10_5_ = auVar85._10_5_;
        auVar110[8] = auVar237[4];
        auVar110._0_8_ = auVar237._0_8_;
        auVar110._9_6_ = auVar101._9_6_;
        auVar159._7_8_ = 0;
        auVar159._0_7_ = auVar110._8_7_;
        auVar183._1_8_ = SUB158(auVar159 << 0x40,7);
        auVar183[0] = auVar237[3];
        auVar183._9_6_ = 0;
        auVar184._1_10_ = SUB1510(auVar183 << 0x30,5);
        auVar184[0] = auVar237[2];
        auVar184._11_4_ = 0;
        auVar238._3_12_ = SUB1512(auVar184 << 0x20,3);
        auVar238[2] = auVar237[1];
        auVar238[0] = auVar237[0];
        auVar238[1] = 0;
        auVar238[0xf] = 0;
        auVar22[0xd] = 0;
        auVar22._0_13_ = local_148._0_13_;
        auVar22[0xe] = local_148[7];
        auVar38[0xc] = local_148[6];
        auVar38._0_12_ = local_148._0_12_;
        auVar38._13_2_ = auVar22._13_2_;
        auVar54[0xb] = 0;
        auVar54._0_11_ = local_148._0_11_;
        auVar54._12_3_ = auVar38._12_3_;
        auVar70[10] = local_148[5];
        auVar70._0_10_ = local_148._0_10_;
        auVar70._11_4_ = auVar54._11_4_;
        auVar86[9] = 0;
        auVar86._0_9_ = local_148._0_9_;
        auVar86._10_5_ = auVar70._10_5_;
        auVar102[8] = local_148[4];
        auVar102._0_8_ = local_148._0_8_;
        auVar102._9_6_ = auVar86._9_6_;
        auVar160._7_8_ = 0;
        auVar160._0_7_ = auVar102._8_7_;
        auVar185._1_8_ = SUB158(auVar160 << 0x40,7);
        auVar185[0] = local_148[3];
        auVar185._9_6_ = 0;
        auVar186._1_10_ = SUB1510(auVar185 << 0x30,5);
        auVar186[0] = local_148[2];
        auVar186._11_4_ = 0;
        auVar117[2] = local_148[1];
        auVar117._0_2_ = local_148._0_2_;
        auVar117._3_12_ = SUB1512(auVar186 << 0x20,3);
        auVar294._0_2_ = local_148._0_2_ & 0xff;
        auVar294._2_13_ = auVar117._2_13_;
        auVar294[0xf] = 0;
        auVar149._4_4_ = uVar127;
        auVar149._0_4_ = uVar127;
        auVar149._8_4_ = uVar127;
        auVar149._12_4_ = uVar127;
        auVar247 = pmaddwd(auVar238,auVar149);
        auVar145._4_4_ = uVar128;
        auVar145._0_4_ = uVar128;
        auVar145._8_4_ = uVar128;
        auVar145._12_4_ = uVar128;
        auVar295 = pmaddwd(auVar294,auVar145);
        auVar23[0xd] = 0;
        auVar23._0_13_ = auVar226._0_13_;
        auVar23[0xe] = auVar226[7];
        auVar39[0xc] = auVar226[6];
        auVar39._0_12_ = auVar226._0_12_;
        auVar39._13_2_ = auVar23._13_2_;
        auVar55[0xb] = 0;
        auVar55._0_11_ = auVar226._0_11_;
        auVar55._12_3_ = auVar39._12_3_;
        auVar71[10] = auVar226[5];
        auVar71._0_10_ = auVar226._0_10_;
        auVar71._11_4_ = auVar55._11_4_;
        auVar87[9] = 0;
        auVar87._0_9_ = auVar226._0_9_;
        auVar87._10_5_ = auVar71._10_5_;
        auVar103[8] = auVar226[4];
        auVar103._0_8_ = auVar226._0_8_;
        auVar103._9_6_ = auVar87._9_6_;
        auVar161._7_8_ = 0;
        auVar161._0_7_ = auVar103._8_7_;
        auVar187._1_8_ = SUB158(auVar161 << 0x40,7);
        auVar187[0] = auVar226[3];
        auVar187._9_6_ = 0;
        auVar188._1_10_ = SUB1510(auVar187 << 0x30,5);
        auVar188[0] = auVar226[2];
        auVar188._11_4_ = 0;
        auVar239._3_12_ = SUB1512(auVar188 << 0x20,3);
        auVar239[2] = auVar226[1];
        auVar239[0] = auVar226[0];
        auVar239[1] = 0;
        auVar239[0xf] = 0;
        auVar141._4_4_ = uVar129;
        auVar141._0_4_ = uVar129;
        auVar141._8_4_ = uVar129;
        auVar141._12_4_ = uVar129;
        auVar240 = pmaddwd(auVar239,auVar141);
        auVar24[0xd] = 0;
        auVar24._0_13_ = auVar245._0_13_;
        auVar24[0xe] = uVar328;
        auVar40[0xc] = uVar243;
        auVar40._0_12_ = auVar245._0_12_;
        auVar40._13_2_ = auVar24._13_2_;
        auVar56[0xb] = 0;
        auVar56._0_11_ = auVar245._0_11_;
        auVar56._12_3_ = auVar40._12_3_;
        auVar72[10] = uVar325;
        auVar72._0_10_ = auVar245._0_10_;
        auVar72._11_4_ = auVar56._11_4_;
        auVar88[9] = 0;
        auVar88._0_9_ = auVar245._0_9_;
        auVar88._10_5_ = auVar72._10_5_;
        auVar104[8] = uVar242;
        auVar104._0_8_ = auVar245._0_8_;
        auVar104._9_6_ = auVar88._9_6_;
        auVar162._7_8_ = 0;
        auVar162._0_7_ = auVar104._8_7_;
        auVar189._1_8_ = SUB158(auVar162 << 0x40,7);
        auVar189[0] = uVar324;
        auVar189._9_6_ = 0;
        auVar190._1_10_ = SUB1510(auVar189 << 0x30,5);
        auVar190[0] = uVar241;
        auVar190._11_4_ = 0;
        auVar118[2] = bVar358;
        auVar118._0_2_ = auVar245._0_2_;
        auVar118._3_12_ = SUB1512(auVar190 << 0x20,3);
        auVar351[1] = 0;
        auVar351[0] = (byte)uVar3;
        auVar351._2_13_ = auVar118._2_13_;
        auVar351[0xf] = 0;
        auVar137._4_4_ = uVar130;
        auVar137._0_4_ = uVar130;
        auVar137._8_4_ = uVar130;
        auVar137._12_4_ = uVar130;
        auVar352 = pmaddwd(auVar351,auVar137);
        auVar227[1] = 0;
        auVar227[0] = auVar237[8];
        auVar227[2] = auVar237[9];
        auVar227[3] = 0;
        auVar227[4] = auVar237[10];
        auVar227[5] = 0;
        auVar227[6] = auVar237[0xb];
        auVar227[7] = 0;
        auVar227[8] = auVar237[0xc];
        auVar227[9] = 0;
        auVar227[10] = auVar237[0xd];
        auVar227[0xb] = 0;
        auVar227[0xc] = auVar237[0xe];
        auVar227[0xd] = 0;
        auVar227[0xe] = auVar237[0xf];
        auVar227[0xf] = 0;
        auVar326[1] = 0;
        auVar326[0] = local_148[8];
        auVar326[2] = local_148[9];
        auVar326[3] = 0;
        auVar326[4] = local_148[10];
        auVar326[5] = 0;
        auVar326[6] = local_148[0xb];
        auVar326[7] = 0;
        auVar326[8] = local_148[0xc];
        auVar326[9] = 0;
        auVar326[10] = local_148[0xd];
        auVar326[0xb] = 0;
        auVar326[0xc] = local_148[0xe];
        auVar326[0xd] = 0;
        auVar326[0xe] = local_148[0xf];
        auVar326[0xf] = 0;
        auVar237 = pmaddwd(auVar227,auVar149);
        auVar327 = pmaddwd(auVar326,auVar145);
        auVar338[1] = 0;
        auVar338[0] = auVar226[8];
        auVar338[2] = auVar226[9];
        auVar338[3] = 0;
        auVar338[4] = auVar226[10];
        auVar338[5] = 0;
        auVar338[6] = auVar226[0xb];
        auVar338[7] = 0;
        auVar338[8] = auVar226[0xc];
        auVar338[9] = 0;
        auVar338[10] = auVar226[0xd];
        auVar338[0xb] = 0;
        auVar338[0xc] = auVar226[0xe];
        auVar338[0xd] = 0;
        auVar338[0xe] = auVar226[0xf];
        auVar338[0xf] = 0;
        auVar339 = pmaddwd(auVar338,auVar141);
        auVar296[1] = 0;
        auVar296[0] = bVar287;
        auVar296[2] = bVar377;
        auVar296[3] = 0;
        auVar296[4] = uVar284;
        auVar296[5] = 0;
        auVar296[6] = uVar329;
        auVar296[7] = 0;
        auVar296[8] = uVar285;
        auVar296[9] = 0;
        auVar296[10] = uVar330;
        auVar296[0xb] = 0;
        auVar296[0xc] = uVar286;
        auVar296[0xd] = 0;
        auVar296[0xe] = uVar340;
        auVar296[0xf] = 0;
        auVar297 = pmaddwd(auVar296,auVar137);
        uVar3 = *(ulong *)(puVar212 + lVar205);
        auVar353._0_4_ =
             (auVar352._0_4_ + auVar240._0_4_ + auVar295._0_4_ + auVar247._0_4_ << iVar207) +
             iVar236 >> auVar289;
        auVar353._4_4_ =
             auVar352._4_4_ + auVar240._4_4_ + auVar295._4_4_ + auVar247._4_4_ + iVar236 >> auVar289
        ;
        auVar353._8_4_ =
             auVar352._8_4_ + auVar240._8_4_ + auVar295._8_4_ + auVar247._8_4_ + iVar236 >> auVar289
        ;
        auVar353._12_4_ =
             auVar352._12_4_ + auVar240._12_4_ + auVar295._12_4_ + auVar247._12_4_ + iVar236 >>
             auVar289;
        uVar288 = (undefined1)(uVar3 >> 0x38);
        auVar375._8_6_ = 0;
        auVar375._0_8_ = uVar4;
        auVar375[0xe] = uVar340;
        auVar375[0xf] = uVar288;
        uVar286 = (undefined1)(uVar3 >> 0x30);
        auVar374._14_2_ = auVar375._14_2_;
        auVar374._8_5_ = 0;
        auVar374._0_8_ = uVar4;
        auVar374[0xd] = uVar286;
        auVar373._13_3_ = auVar374._13_3_;
        auVar373._8_4_ = 0;
        auVar373._0_8_ = uVar4;
        auVar373[0xc] = uVar330;
        uVar285 = (undefined1)(uVar3 >> 0x28);
        auVar372._12_4_ = auVar373._12_4_;
        auVar372._8_3_ = 0;
        auVar372._0_8_ = uVar4;
        auVar372[0xb] = uVar285;
        auVar371._11_5_ = auVar372._11_5_;
        auVar371._8_2_ = 0;
        auVar371._0_8_ = uVar4;
        auVar371[10] = uVar329;
        uVar284 = (undefined1)(uVar3 >> 0x20);
        auVar370._10_6_ = auVar371._10_6_;
        auVar370[8] = 0;
        auVar370._0_8_ = uVar4;
        auVar370[9] = uVar284;
        auVar369._9_7_ = auVar370._9_7_;
        auVar369[8] = bVar377;
        auVar369._0_8_ = uVar4;
        uVar243 = (undefined1)(uVar3 >> 0x18);
        auVar368._8_8_ = auVar369._8_8_;
        auVar368[7] = uVar243;
        auVar368[6] = uVar328;
        uVar242 = (undefined1)(uVar3 >> 0x10);
        auVar368[5] = uVar242;
        auVar368[4] = uVar325;
        uVar241 = (undefined1)(uVar3 >> 8);
        auVar368[3] = uVar241;
        auVar368[2] = uVar324;
        auVar368._0_2_ = CONCAT11((char)uVar3,bVar358);
        auVar298._0_4_ =
             (auVar297._0_4_ + auVar339._0_4_ + auVar327._0_4_ + auVar237._0_4_ << iVar207) +
             iVar236 >> auVar289;
        auVar298._4_4_ =
             auVar297._4_4_ + auVar339._4_4_ + auVar327._4_4_ + auVar237._4_4_ + iVar236 >> auVar289
        ;
        auVar298._8_4_ =
             auVar297._8_4_ + auVar339._8_4_ + auVar327._8_4_ + auVar237._8_4_ + iVar236 >> auVar289
        ;
        auVar298._12_4_ =
             auVar297._12_4_ + auVar339._12_4_ + auVar327._12_4_ + auVar237._12_4_ + iVar236 >>
             auVar289;
        auVar237 = packssdw(auVar353,auVar298);
        sVar216 = auVar237._0_2_ + sVar244;
        sVar228 = auVar237._2_2_ + sVar261;
        sVar229 = auVar237._4_2_ + sVar244;
        sVar230 = auVar237._6_2_ + sVar261;
        sVar231 = auVar237._8_2_ + sVar244;
        sVar232 = auVar237._10_2_ + sVar261;
        sVar233 = auVar237._12_2_ + sVar244;
        sVar234 = auVar237._14_2_ + sVar261;
        if (iVar211 == 0) {
          *(short *)*pauVar204 = sVar216;
          *(short *)(*pauVar204 + 2) = sVar228;
          *(short *)(*pauVar204 + 4) = sVar229;
          *(short *)(*pauVar204 + 6) = sVar230;
          *(short *)(*pauVar204 + 8) = sVar231;
          *(short *)(*pauVar204 + 10) = sVar232;
          *(short *)(*pauVar204 + 0xc) = sVar233;
          *(short *)(*pauVar204 + 0xe) = sVar234;
        }
        else {
          auVar237 = *pauVar204;
          if (iVar6 == 0) {
            auVar354._0_2_ = sVar216 + auVar237._0_2_;
            auVar354._2_2_ = sVar228 + auVar237._2_2_;
            auVar354._4_2_ = sVar229 + auVar237._4_2_;
            auVar354._6_2_ = sVar230 + auVar237._6_2_;
            auVar354._8_2_ = sVar231 + auVar237._8_2_;
            auVar354._10_2_ = sVar232 + auVar237._10_2_;
            auVar354._12_2_ = sVar233 + auVar237._12_2_;
            auVar354._14_2_ = sVar234 + auVar237._14_2_;
            auVar237 = psraw(auVar354,1);
          }
          else {
            auVar302._0_12_ = auVar237._0_12_;
            auVar302._12_2_ = auVar237._6_2_;
            auVar302._14_2_ = sVar230;
            auVar301._12_4_ = auVar302._12_4_;
            auVar301._0_10_ = auVar237._0_10_;
            auVar301._10_2_ = sVar229;
            auVar300._10_6_ = auVar301._10_6_;
            auVar300._0_8_ = auVar237._0_8_;
            auVar300._8_2_ = auVar237._4_2_;
            auVar299._8_8_ = auVar300._8_8_;
            auVar299._6_2_ = sVar228;
            auVar299._4_2_ = auVar237._2_2_;
            auVar299._2_2_ = sVar216;
            auVar299._0_2_ = auVar237._0_2_;
            auVar316._2_2_ = sVar231;
            auVar316._0_2_ = auVar237._8_2_;
            auVar316._4_2_ = auVar237._10_2_;
            auVar316._6_2_ = sVar232;
            auVar316._8_2_ = auVar237._12_2_;
            auVar316._10_2_ = sVar233;
            auVar316._12_2_ = auVar237._14_2_;
            auVar316._14_2_ = sVar234;
            auVar133._4_4_ = uVar235;
            auVar133._0_4_ = uVar235;
            auVar133._8_4_ = uVar235;
            auVar133._12_4_ = uVar235;
            auVar237 = pmaddwd(auVar299,auVar133);
            auVar247 = pmaddwd(auVar316,auVar133);
            auVar303._0_4_ = auVar237._0_4_ >> 4;
            auVar303._4_4_ = auVar237._4_4_ >> 4;
            auVar303._8_4_ = auVar237._8_4_ >> 4;
            auVar303._12_4_ = auVar237._12_4_ >> 4;
            auVar317._0_4_ = auVar247._0_4_ >> 4;
            auVar317._4_4_ = auVar247._4_4_ >> 4;
            auVar317._8_4_ = auVar247._8_4_ >> 4;
            auVar317._12_4_ = auVar247._12_4_ >> 4;
            auVar237 = packssdw(auVar303,auVar317);
          }
          auVar304._0_2_ = auVar237._0_2_ + (sVar322 - sVar244);
          auVar304._2_2_ = auVar237._2_2_ + (sVar323 - sVar261);
          auVar304._4_2_ = auVar237._4_2_ + (sVar322 - sVar244);
          auVar304._6_2_ = auVar237._6_2_ + (sVar323 - sVar261);
          auVar304._8_2_ = auVar237._8_2_ + (sVar322 - sVar244);
          auVar304._10_2_ = auVar237._10_2_ + (sVar323 - sVar261);
          auVar304._12_2_ = auVar237._12_2_ + (sVar322 - sVar244);
          auVar304._14_2_ = auVar237._14_2_ + (sVar323 - sVar261);
          auVar237 = psraw(auVar304,ZEXT416(uVar200));
          sVar216 = auVar237._0_2_;
          sVar228 = auVar237._2_2_;
          sVar229 = auVar237._4_2_;
          sVar230 = auVar237._6_2_;
          sVar231 = auVar237._8_2_;
          sVar232 = auVar237._10_2_;
          sVar233 = auVar237._12_2_;
          sVar234 = auVar237._14_2_;
          *(ulong *)(puVar201 + lVar205) =
               CONCAT17((0 < sVar234) * (sVar234 < 0x100) * auVar237[0xe] - (0xff < sVar234),
                        CONCAT16((0 < sVar233) * (sVar233 < 0x100) * auVar237[0xc] -
                                 (0xff < sVar233),
                                 CONCAT15((0 < sVar232) * (sVar232 < 0x100) * auVar237[10] -
                                          (0xff < sVar232),
                                          CONCAT14((0 < sVar231) * (sVar231 < 0x100) * auVar237[8] -
                                                   (0xff < sVar231),
                                                   CONCAT13((0 < sVar230) * (sVar230 < 0x100) *
                                                            auVar237[6] - (0xff < sVar230),
                                                            CONCAT12((0 < sVar229) *
                                                                     (sVar229 < 0x100) * auVar237[4]
                                                                     - (0xff < sVar229),
                                                                     CONCAT11((0 < sVar228) *
                                                                              (sVar228 < 0x100) *
                                                                              auVar237[2] -
                                                                              (0xff < sVar228),
                                                                              (0 < sVar216) *
                                                                              (sVar216 < 0x100) *
                                                                              auVar237[0] -
                                                                              (0xff < sVar216)))))))
                       );
        }
        auVar25[0xd] = 0;
        auVar25._0_13_ = auVar263._0_13_;
        auVar25[0xe] = auVar263[7];
        auVar41[0xc] = auVar263[6];
        auVar41._0_12_ = auVar263._0_12_;
        auVar41._13_2_ = auVar25._13_2_;
        auVar57[0xb] = 0;
        auVar57._0_11_ = auVar263._0_11_;
        auVar57._12_3_ = auVar41._12_3_;
        auVar73[10] = auVar263[5];
        auVar73._0_10_ = auVar263._0_10_;
        auVar73._11_4_ = auVar57._11_4_;
        auVar89[9] = 0;
        auVar89._0_9_ = auVar263._0_9_;
        auVar89._10_5_ = auVar73._10_5_;
        auVar105[8] = auVar263[4];
        auVar105._0_8_ = auVar263._0_8_;
        auVar105._9_6_ = auVar89._9_6_;
        auVar163._7_8_ = 0;
        auVar163._0_7_ = auVar105._8_7_;
        auVar191._1_8_ = SUB158(auVar163 << 0x40,7);
        auVar191[0] = auVar263[3];
        auVar191._9_6_ = 0;
        auVar192._1_10_ = SUB1510(auVar191 << 0x30,5);
        auVar192[0] = auVar263[2];
        auVar192._11_4_ = 0;
        auVar119[2] = auVar263[1];
        auVar119._0_2_ = auVar263._0_2_;
        auVar119._3_12_ = SUB1512(auVar192 << 0x20,3);
        auVar305._0_2_ = auVar263._0_2_ & 0xff;
        auVar305._2_13_ = auVar119._2_13_;
        auVar305[0xf] = 0;
        auVar26[0xd] = 0;
        auVar26._0_13_ = auVar225._0_13_;
        auVar26[0xe] = auVar225[7];
        auVar42[0xc] = auVar225[6];
        auVar42._0_12_ = auVar225._0_12_;
        auVar42._13_2_ = auVar26._13_2_;
        auVar58[0xb] = 0;
        auVar58._0_11_ = auVar225._0_11_;
        auVar58._12_3_ = auVar42._12_3_;
        auVar74[10] = auVar225[5];
        auVar74._0_10_ = auVar225._0_10_;
        auVar74._11_4_ = auVar58._11_4_;
        auVar90[9] = 0;
        auVar90._0_9_ = auVar225._0_9_;
        auVar90._10_5_ = auVar74._10_5_;
        auVar106[8] = auVar225[4];
        auVar106._0_8_ = auVar225._0_8_;
        auVar106._9_6_ = auVar90._9_6_;
        auVar164._7_8_ = 0;
        auVar164._0_7_ = auVar106._8_7_;
        auVar193._1_8_ = SUB158(auVar164 << 0x40,7);
        auVar193[0] = auVar225[3];
        auVar193._9_6_ = 0;
        auVar194._1_10_ = SUB1510(auVar193 << 0x30,5);
        auVar194[0] = auVar225[2];
        auVar194._11_4_ = 0;
        auVar120[2] = auVar225[1];
        auVar120._0_2_ = auVar225._0_2_;
        auVar120._3_12_ = SUB1512(auVar194 << 0x20,3);
        auVar318._0_2_ = auVar225._0_2_ & 0xff;
        auVar318._2_13_ = auVar120._2_13_;
        auVar318[0xf] = 0;
        auVar150._4_4_ = uVar127;
        auVar150._0_4_ = uVar127;
        auVar150._8_4_ = uVar127;
        auVar150._12_4_ = uVar127;
        auVar237 = pmaddwd(auVar305,auVar150);
        auVar146._4_4_ = uVar128;
        auVar146._0_4_ = uVar128;
        auVar146._8_4_ = uVar128;
        auVar146._12_4_ = uVar128;
        auVar295 = pmaddwd(auVar318,auVar146);
        auVar27[0xd] = 0;
        auVar27._0_13_ = auVar360._0_13_;
        auVar27[0xe] = auVar360[7];
        auVar43[0xc] = auVar360[6];
        auVar43._0_12_ = auVar360._0_12_;
        auVar43._13_2_ = auVar27._13_2_;
        auVar59[0xb] = 0;
        auVar59._0_11_ = auVar360._0_11_;
        auVar59._12_3_ = auVar43._12_3_;
        auVar75[10] = auVar360[5];
        auVar75._0_10_ = auVar360._0_10_;
        auVar75._11_4_ = auVar59._11_4_;
        auVar91[9] = 0;
        auVar91._0_9_ = auVar360._0_9_;
        auVar91._10_5_ = auVar75._10_5_;
        auVar107[8] = auVar360[4];
        auVar107._0_8_ = auVar360._0_8_;
        auVar107._9_6_ = auVar91._9_6_;
        auVar165._7_8_ = 0;
        auVar165._0_7_ = auVar107._8_7_;
        auVar195._1_8_ = SUB158(auVar165 << 0x40,7);
        auVar195[0] = auVar360[3];
        auVar195._9_6_ = 0;
        auVar196._1_10_ = SUB1510(auVar195 << 0x30,5);
        auVar196[0] = auVar360[2];
        auVar196._11_4_ = 0;
        auVar121[2] = auVar360[1];
        auVar121._0_2_ = auVar360._0_2_;
        auVar121._3_12_ = SUB1512(auVar196 << 0x20,3);
        auVar306._0_2_ = auVar360._0_2_ & 0xff;
        auVar306._2_13_ = auVar121._2_13_;
        auVar306[0xf] = 0;
        auVar142._4_4_ = uVar129;
        auVar142._0_4_ = uVar129;
        auVar142._8_4_ = uVar129;
        auVar142._12_4_ = uVar129;
        auVar247 = pmaddwd(auVar306,auVar142);
        auVar28[0xd] = 0;
        auVar28._0_13_ = auVar368._0_13_;
        auVar28[0xe] = uVar243;
        auVar44[0xc] = uVar328;
        auVar44._0_12_ = auVar368._0_12_;
        auVar44._13_2_ = auVar28._13_2_;
        auVar60[0xb] = 0;
        auVar60._0_11_ = auVar368._0_11_;
        auVar60._12_3_ = auVar44._12_3_;
        auVar76[10] = uVar242;
        auVar76._0_10_ = auVar368._0_10_;
        auVar76._11_4_ = auVar60._11_4_;
        auVar92[9] = 0;
        auVar92._0_9_ = auVar368._0_9_;
        auVar92._10_5_ = auVar76._10_5_;
        auVar108[8] = uVar325;
        auVar108._0_8_ = auVar368._0_8_;
        auVar108._9_6_ = auVar92._9_6_;
        auVar166._7_8_ = 0;
        auVar166._0_7_ = auVar108._8_7_;
        auVar197._1_8_ = SUB158(auVar166 << 0x40,7);
        auVar197[0] = uVar241;
        auVar197._9_6_ = 0;
        auVar198._1_10_ = SUB1510(auVar197 << 0x30,5);
        auVar198[0] = uVar324;
        auVar198._11_4_ = 0;
        auVar122[2] = (char)uVar3;
        auVar122._0_2_ = auVar368._0_2_;
        auVar122._3_12_ = SUB1512(auVar198 << 0x20,3);
        auVar355[1] = 0;
        auVar355[0] = bVar358;
        auVar355._2_13_ = auVar122._2_13_;
        auVar355[0xf] = 0;
        auVar138._4_4_ = uVar130;
        auVar138._0_4_ = uVar130;
        auVar138._8_4_ = uVar130;
        auVar138._12_4_ = uVar130;
        auVar339 = pmaddwd(auVar355,auVar138);
        auVar350[1] = 0;
        auVar350[0] = auVar263[8];
        auVar350[2] = auVar263[9];
        auVar350[3] = 0;
        auVar350[4] = auVar263[10];
        auVar350[5] = 0;
        auVar350[6] = auVar263[0xb];
        auVar350[7] = 0;
        auVar350[8] = auVar263[0xc];
        auVar350[9] = 0;
        auVar350[10] = auVar263[0xd];
        auVar350[0xb] = 0;
        auVar350[0xc] = auVar263[0xe];
        auVar350[0xd] = 0;
        auVar350[0xe] = auVar263[0xf];
        auVar350[0xf] = 0;
        auVar307[1] = 0;
        auVar307[0] = auVar225[8];
        auVar307[2] = auVar225[9];
        auVar307[3] = 0;
        auVar307[4] = auVar225[10];
        auVar307[5] = 0;
        auVar307[6] = auVar225[0xb];
        auVar307[7] = 0;
        auVar307[8] = auVar225[0xc];
        auVar307[9] = 0;
        auVar307[10] = auVar225[0xd];
        auVar307[0xb] = 0;
        auVar307[0xc] = auVar225[0xe];
        auVar307[0xd] = 0;
        auVar307[0xe] = auVar225[0xf];
        auVar307[0xf] = 0;
        auVar327 = pmaddwd(auVar350,auVar150);
        auVar263 = pmaddwd(auVar307,auVar146);
        auVar319[1] = 0;
        auVar319[0] = auVar360[8];
        auVar319[2] = auVar360[9];
        auVar319[3] = 0;
        auVar319[4] = auVar360[10];
        auVar319[5] = 0;
        auVar319[6] = auVar360[0xb];
        auVar319[7] = 0;
        auVar319[8] = auVar360[0xc];
        auVar319[9] = 0;
        auVar319[10] = auVar360[0xd];
        auVar319[0xb] = 0;
        auVar319[0xc] = auVar360[0xe];
        auVar319[0xd] = 0;
        auVar319[0xe] = auVar360[0xf];
        auVar319[0xf] = 0;
        auVar297 = pmaddwd(auVar319,auVar142);
        auVar308[1] = 0;
        auVar308[0] = bVar377;
        auVar308[2] = uVar284;
        auVar308[3] = 0;
        auVar308[4] = uVar329;
        auVar308[5] = 0;
        auVar308[6] = uVar285;
        auVar308[7] = 0;
        auVar308[8] = uVar330;
        auVar308[9] = 0;
        auVar308[10] = uVar286;
        auVar308[0xb] = 0;
        auVar308[0xc] = uVar340;
        auVar308[0xd] = 0;
        auVar308[0xe] = uVar288;
        auVar308[0xf] = 0;
        auVar240 = pmaddwd(auVar308,auVar138);
        auVar356._0_4_ =
             (auVar339._0_4_ + auVar247._0_4_ + auVar295._0_4_ + auVar237._0_4_ << iVar207) +
             iVar236 >> auVar289;
        auVar356._4_4_ =
             auVar339._4_4_ + auVar247._4_4_ + auVar295._4_4_ + auVar237._4_4_ + iVar236 >> auVar289
        ;
        auVar356._8_4_ =
             auVar339._8_4_ + auVar247._8_4_ + auVar295._8_4_ + auVar237._8_4_ + iVar236 >> auVar289
        ;
        auVar356._12_4_ =
             auVar339._12_4_ + auVar247._12_4_ + auVar295._12_4_ + auVar237._12_4_ + iVar236 >>
             auVar289;
        auVar309._0_4_ =
             (auVar240._0_4_ + auVar297._0_4_ + auVar263._0_4_ + auVar327._0_4_ << iVar207) +
             iVar236 >> auVar289;
        auVar309._4_4_ =
             auVar240._4_4_ + auVar297._4_4_ + auVar263._4_4_ + auVar327._4_4_ + iVar236 >> auVar289
        ;
        auVar309._8_4_ =
             auVar240._8_4_ + auVar297._8_4_ + auVar263._8_4_ + auVar327._8_4_ + iVar236 >> auVar289
        ;
        auVar309._12_4_ =
             auVar240._12_4_ + auVar297._12_4_ + auVar263._12_4_ + auVar327._12_4_ + iVar236 >>
             auVar289;
        auVar237 = packssdw(auVar356,auVar309);
        sVar216 = auVar237._0_2_ + sVar244;
        sVar228 = auVar237._2_2_ + sVar261;
        sVar229 = auVar237._4_2_ + sVar244;
        sVar230 = auVar237._6_2_ + sVar261;
        sVar231 = auVar237._8_2_ + sVar244;
        sVar232 = auVar237._10_2_ + sVar261;
        sVar233 = auVar237._12_2_ + sVar244;
        sVar234 = auVar237._14_2_ + sVar261;
        if (iVar211 == 0) {
          psVar2 = (short *)(*pauVar204 + lVar213 * 2);
          *psVar2 = sVar216;
          psVar2[1] = sVar228;
          psVar2[2] = sVar229;
          psVar2[3] = sVar230;
          psVar2[4] = sVar231;
          psVar2[5] = sVar232;
          psVar2[6] = sVar233;
          psVar2[7] = sVar234;
        }
        else {
          auVar237 = *(undefined1 (*) [16])(*pauVar204 + lVar213 * 2);
          if (iVar6 == 0) {
            auVar357._0_2_ = sVar216 + auVar237._0_2_;
            auVar357._2_2_ = sVar228 + auVar237._2_2_;
            auVar357._4_2_ = sVar229 + auVar237._4_2_;
            auVar357._6_2_ = sVar230 + auVar237._6_2_;
            auVar357._8_2_ = sVar231 + auVar237._8_2_;
            auVar357._10_2_ = sVar232 + auVar237._10_2_;
            auVar357._12_2_ = sVar233 + auVar237._12_2_;
            auVar357._14_2_ = sVar234 + auVar237._14_2_;
            auVar237 = psraw(auVar357,1);
          }
          else {
            auVar313._0_12_ = auVar237._0_12_;
            auVar313._12_2_ = auVar237._6_2_;
            auVar313._14_2_ = sVar230;
            auVar312._12_4_ = auVar313._12_4_;
            auVar312._0_10_ = auVar237._0_10_;
            auVar312._10_2_ = sVar229;
            auVar311._10_6_ = auVar312._10_6_;
            auVar311._0_8_ = auVar237._0_8_;
            auVar311._8_2_ = auVar237._4_2_;
            auVar310._8_8_ = auVar311._8_8_;
            auVar310._6_2_ = sVar228;
            auVar310._4_2_ = auVar237._2_2_;
            auVar310._2_2_ = sVar216;
            auVar310._0_2_ = auVar237._0_2_;
            auVar320._2_2_ = sVar231;
            auVar320._0_2_ = auVar237._8_2_;
            auVar320._4_2_ = auVar237._10_2_;
            auVar320._6_2_ = sVar232;
            auVar320._8_2_ = auVar237._12_2_;
            auVar320._10_2_ = sVar233;
            auVar320._12_2_ = auVar237._14_2_;
            auVar320._14_2_ = sVar234;
            auVar134._4_4_ = uVar235;
            auVar134._0_4_ = uVar235;
            auVar134._8_4_ = uVar235;
            auVar134._12_4_ = uVar235;
            auVar237 = pmaddwd(auVar310,auVar134);
            auVar247 = pmaddwd(auVar320,auVar134);
            auVar314._0_4_ = auVar237._0_4_ >> 4;
            auVar314._4_4_ = auVar237._4_4_ >> 4;
            auVar314._8_4_ = auVar237._8_4_ >> 4;
            auVar314._12_4_ = auVar237._12_4_ >> 4;
            auVar321._0_4_ = auVar247._0_4_ >> 4;
            auVar321._4_4_ = auVar247._4_4_ >> 4;
            auVar321._8_4_ = auVar247._8_4_ >> 4;
            auVar321._12_4_ = auVar247._12_4_ >> 4;
            auVar237 = packssdw(auVar314,auVar321);
          }
          auVar315._0_2_ = auVar237._0_2_ + (sVar322 - sVar244);
          auVar315._2_2_ = auVar237._2_2_ + (sVar323 - sVar261);
          auVar315._4_2_ = auVar237._4_2_ + (sVar322 - sVar244);
          auVar315._6_2_ = auVar237._6_2_ + (sVar323 - sVar261);
          auVar315._8_2_ = auVar237._8_2_ + (sVar322 - sVar244);
          auVar315._10_2_ = auVar237._10_2_ + (sVar323 - sVar261);
          auVar315._12_2_ = auVar237._12_2_ + (sVar322 - sVar244);
          auVar315._14_2_ = auVar237._14_2_ + (sVar323 - sVar261);
          auVar237 = psraw(auVar315,ZEXT416(uVar200));
          sVar216 = auVar237._0_2_;
          sVar228 = auVar237._2_2_;
          sVar229 = auVar237._4_2_;
          sVar230 = auVar237._6_2_;
          sVar231 = auVar237._8_2_;
          sVar232 = auVar237._10_2_;
          sVar233 = auVar237._12_2_;
          sVar234 = auVar237._14_2_;
          *(ulong *)(puVar206 + lVar205) =
               CONCAT17((0 < sVar234) * (sVar234 < 0x100) * auVar237[0xe] - (0xff < sVar234),
                        CONCAT16((0 < sVar233) * (sVar233 < 0x100) * auVar237[0xc] -
                                 (0xff < sVar233),
                                 CONCAT15((0 < sVar232) * (sVar232 < 0x100) * auVar237[10] -
                                          (0xff < sVar232),
                                          CONCAT14((0 < sVar231) * (sVar231 < 0x100) * auVar237[8] -
                                                   (0xff < sVar231),
                                                   CONCAT13((0 < sVar230) * (sVar230 < 0x100) *
                                                            auVar237[6] - (0xff < sVar230),
                                                            CONCAT12((0 < sVar229) *
                                                                     (sVar229 < 0x100) * auVar237[4]
                                                                     - (0xff < sVar229),
                                                                     CONCAT11((0 < sVar228) *
                                                                              (sVar228 < 0x100) *
                                                                              auVar237[2] -
                                                                              (0xff < sVar228),
                                                                              (0 < sVar216) *
                                                                              (sVar216 < 0x100) *
                                                                              auVar237[0] -
                                                                              (0xff < sVar216)))))))
                       );
        }
        lVar215 = lVar215 + 2;
        pauVar204 = (undefined1 (*) [16])(*pauVar204 + lVar213 * 4);
        puVar206 = puVar206 + lVar14;
        puVar201 = puVar201 + lVar14;
        puVar212 = puVar212 + lVar202 * 2;
        puVar209 = puVar209 + lVar202 * 2;
        auVar237 = local_148;
        auVar247 = auVar360;
        auVar263 = auVar225;
        auVar360 = auVar368;
        local_148 = auVar226;
      } while (lVar215 < h);
      lVar205 = lVar205 + 8;
      pauVar203 = pauVar203 + 1;
    } while (lVar205 < w);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i wt0 = _mm_set1_epi16(conv_params->fwd_offset);
  const __m128i wt1 = _mm_set1_epi16(conv_params->bck_offset);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

  if (w == 4) {
    __m128i s[8], src6, res, res_shift;
    s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                             xx_loadl_32(src_ptr + 1 * src_stride));
    s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                             xx_loadl_32(src_ptr + 2 * src_stride));
    s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                             xx_loadl_32(src_ptr + 3 * src_stride));
    s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                             xx_loadl_32(src_ptr + 4 * src_stride));
    s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                             xx_loadl_32(src_ptr + 5 * src_stride));
    src6 = xx_loadl_32(src_ptr + 6 * src_stride);
    s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

    do {
      s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
      src6 = xx_loadl_32(src_ptr + 8 * src_stride);
      s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

      res = convolve_lo_y(s + 0, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      __m128i res_16b = _mm_packs_epi32(res_shift, res_shift);
      __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      res = convolve_lo_y(s + 1, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      res_16b = _mm_packs_epi32(res_shift, res_shift);
      res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
      s[3] = s[5];
      s[4] = s[6];
      s[5] = s[7];
      h -= 2;
    } while (h);
  } else {
    assert(!(w % 8));
    int j = 0;
    do {
      __m128i s[8], src6, res_lo, res_hi, res_lo_shift, res_hi_shift;
      const uint8_t *data = &src_ptr[j];

      src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
      s[0] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
      s[1] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
      s[2] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
      s[3] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
      s[4] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
      s[5] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

      int i = 0;
      do {
        data = &src_ptr[i * src_stride + j];
        s[6] = _mm_unpacklo_epi8(
            src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
        src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
        s[7] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

        res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);

        __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);
        res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
      } while (i < h);
      j += 8;
    } while (j < w);
  }
}